

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O3

void __thiscall PrintICT::visit(PrintICT *this,Variable *node)

{
  Fragment *pFVar1;
  char *aux;
  
  this->level = this->level + 1;
  aux = token_id_to_name(node->type);
  printLexemeIR(this,"VARIABLE_",aux);
  this->level = this->level - 1;
  pFVar1 = (node->super_Fragment).next;
  if (pFVar1 != (Fragment *)0x0) {
    (*pFVar1->_vptr_Fragment[2])(pFVar1,this);
    return;
  }
  return;
}

Assistant:

void PrintICT::visit(Variable *node) {
    up_level();
    printLexemeIR("VARIABLE_", token_id_to_name(node->getType()));
    down_level();
    if (node->getNext()) node->getNext()->accept(this);
}